

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_medium.c
# Opt level: O2

block_state deflate_medium(deflate_state *s,int flush)

{
  byte bVar1;
  int iVar2;
  ushort uVar3;
  Pos cur_match;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uchar *puVar13;
  short sVar14;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong local_50;
  ulong local_48;
  ulong uVar15;
  
  iVar2 = s->level;
  uVar19 = 0;
  local_50 = 0;
  uVar8 = 0;
  local_48 = 0;
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      uVar18 = s->lookahead;
      if (flush == 0 && uVar18 < 0x106) {
        return need_more;
      }
      uVar6 = s->strstart;
      if (uVar18 == 0) {
        uVar18 = 2;
        if (uVar6 < 2) {
          uVar18 = uVar6;
        }
        s->insert = uVar18;
        if (flush == 4) {
          iVar2 = s->block_start;
          if ((long)iVar2 < 0) {
            puVar13 = (uchar *)0x0;
          }
          else {
            puVar13 = s->window + iVar2;
          }
          zng_tr_flush_block(s,(char *)puVar13,uVar6 - iVar2,1);
          s->block_start = s->strstart;
          flush_pending(s->strm);
          return finish_done - (s->strm->avail_out == 0);
        }
        if (s->sym_next != 0) {
          iVar2 = s->block_start;
          if ((long)iVar2 < 0) {
            puVar13 = (uchar *)0x0;
          }
          else {
            puVar13 = s->window + iVar2;
          }
          zng_tr_flush_block(s,(char *)puVar13,uVar6 - iVar2,0);
          s->block_start = s->strstart;
          flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
      if (uVar18 < 4) {
        uVar3 = 0;
      }
      else {
LAB_00122d9a:
        uVar3 = quick_insert_string(s,uVar6);
        uVar6 = s->strstart;
      }
      uVar8 = 1;
      uVar5 = 0;
      if (((uVar3 != 0) && (0 < (long)((ulong)uVar6 - (ulong)uVar3))) &&
         (uVar5 = 0, (long)((ulong)uVar6 - (ulong)uVar3) <= (long)(ulong)(s->w_size - 0x106))) {
        uVar4 = longest_match_unaligned_16(s,uVar3);
        if ((uVar4 & 0xfffc) == 0) {
          uVar4 = 1;
        }
        uVar3 = (ushort)s->match_start;
        uVar18 = (uint)uVar3;
        uVar5 = (uint)uVar3;
        if (uVar3 < (ushort)uVar6) {
          uVar16 = (ulong)uVar6;
          uVar8 = uVar4;
          goto LAB_00122dfd;
        }
      }
      uVar18 = uVar5;
      uVar16 = (ulong)uVar6;
    }
    else {
      if (iVar2 < 5) {
LAB_00122d93:
        uVar6 = s->strstart;
        goto LAB_00122d9a;
      }
      uVar6 = (uint)uVar19;
      uVar18 = (uint)local_48;
      uVar16 = local_50;
      if ((short)uVar8 == 0) goto LAB_00122d93;
    }
LAB_00122dfd:
    uVar3 = (ushort)uVar8;
    uVar15 = (ulong)uVar3;
    if ((uVar8 & 0xffff) + 4 < s->lookahead) {
      uVar5 = (uint)uVar16 + 1;
      uVar7 = (uVar8 & 0xffff) - 1;
      uVar4 = uVar7 & 0xffff;
      uVar12 = uVar5 & 0xffff;
      if ((uVar7 & 0xffff) < 3) {
        if (((uVar7 & 0xffff) == 0) || ((ushort)uVar5 < (ushort)uVar6)) goto LAB_00122e2f;
      }
      else if ((ushort)uVar5 < (ushort)uVar6) {
        uVar12 = uVar6 & 0xffff;
        uVar6 = (uVar7 & 0xffff) + (uVar5 & 0xffff);
        uVar4 = uVar6 - uVar12;
        if (uVar6 < uVar12 || uVar4 == 0) goto LAB_00122e2f;
      }
      insert_string(s,uVar12,uVar4);
    }
LAB_00122e2f:
    uVar6 = (uint)uVar16 & 0xffff;
    if (((iVar2 < 5) || (s->lookahead < 0x107)) ||
       (uVar4 = (uVar8 & 0xffff) + uVar6, s->window_size - 0x106 <= uVar4)) {
      uVar15 = (ulong)uVar8;
      uVar8 = 0;
    }
    else {
      s->strstart = uVar4;
      cur_match = quick_insert_string(s,uVar4);
      uVar5 = s->strstart;
      uVar19 = (ulong)uVar5;
      local_50 = uVar19;
      if (((cur_match == 0) || ((long)(uVar19 - cur_match) < 1)) ||
         ((long)(ulong)(s->w_size - 0x106) < (long)(uVar19 - cur_match))) {
        local_48 = 0;
        uVar4 = 1;
      }
      else {
        uVar4 = longest_match_unaligned_16(s,cur_match);
        local_48 = (ulong)s->match_start;
        uVar9 = local_48 & 0xffff;
        uVar10 = uVar19 & 0xffff;
        if (((uint)uVar9 < (uint)uVar10) && (3 < (ushort)uVar4)) {
          if (((1 < uVar3) && ((uVar8 & 0xffff) <= (uint)uVar9 + 1)) &&
             (puVar13 = s->window, puVar13[(uVar9 + 1) - uVar15] == puVar13[(uVar10 + 1) - uVar15]))
          {
            uVar12 = s->w_size - 0x106;
            uVar7 = uVar5 - uVar12 & 0xffff;
            if ((uint)uVar10 <= uVar12) {
              uVar7 = 0;
            }
            lVar11 = 0;
            uVar8 = uVar4;
            while( true ) {
              sVar14 = (short)lVar11;
              if ((((puVar13[lVar11 + (uVar9 - 1)] != puVar13[lVar11 + (uVar10 - 1)]) ||
                   ((ushort)(uVar3 + sVar14) == 0)) || ((uVar5 + (int)lVar11 & 0xffff) <= uVar7)) ||
                 ((0xff < (ushort)uVar8 || ((ushort)((short)s->match_start + sVar14) < 2)))) break;
              uVar8 = uVar8 + 1;
              lVar11 = lVar11 + -1;
            }
            if (((int)lVar11 != 0) &&
               (((ushort)(uVar15 + lVar11) < 2 && ((ushort)((ushort)uVar4 - 2) != sVar14)))) {
              local_50 = uVar19 + lVar11;
              local_48 = local_48 + lVar11;
              uVar19 = (ulong)(uVar5 + 1);
              uVar15 = uVar15 + lVar11 & 0xffffffff;
              uVar4 = uVar8;
            }
          }
        }
        else {
          uVar4 = 1;
        }
      }
      uVar8 = uVar4;
      s->strstart = uVar6;
    }
    uVar5 = (uint)uVar15 & 0xffff;
    if ((ushort)uVar15 < 4) {
      uVar6 = 0;
      while (sVar14 = (short)uVar15, uVar15 = (ulong)(ushort)(sVar14 - 1), sVar14 != 0) {
        bVar1 = s->window[uVar16 & 0xffff];
        uVar18 = s->sym_next;
        s->d_buf[uVar18] = 0;
        s->sym_next = uVar18 + 1;
        s->l_buf[uVar18] = bVar1;
        s->dyn_ltree[bVar1].fc.freq = s->dyn_ltree[bVar1].fc.freq + 1;
        uVar6 = uVar6 + (s->sym_next == s->sym_end);
        s->lookahead = s->lookahead - 1;
        uVar16 = (ulong)((int)uVar16 + 1);
      }
    }
    else {
      iVar17 = uVar6 - (uVar18 & 0xffff);
      uVar6 = s->sym_next;
      s->d_buf[uVar6] = (uint16_t)iVar17;
      s->sym_next = uVar6 + 1;
      s->l_buf[uVar6] = (uchar)(uVar5 - 3);
      s->matches = s->matches + 1;
      s->dyn_ltree[(ulong)""[uVar5 - 3] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[uVar5 - 3] + 0x101].fc.freq + 1;
      uVar18 = iVar17 - 1;
      uVar6 = (uVar18 >> 7) + 0x100;
      if (uVar18 < 0x100) {
        uVar6 = uVar18;
      }
      s->dyn_dtree[""[uVar6]].fc.freq = s->dyn_dtree[""[uVar6]].fc.freq + 1;
      uVar6 = (uint)(s->sym_next == s->sym_end);
      s->lookahead = s->lookahead - uVar5;
    }
    uVar5 = uVar5 + s->strstart;
    s->strstart = uVar5;
    if (uVar6 != 0) {
      iVar17 = s->block_start;
      if ((long)iVar17 < 0) {
        puVar13 = (uchar *)0x0;
      }
      else {
        puVar13 = s->window + iVar17;
      }
      zng_tr_flush_block(s,(char *)puVar13,uVar5 - iVar17,0);
      s->block_start = s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

Z_INTERNAL block_state deflate_medium(deflate_state *s, int flush) {
    /* Align the first struct to start on a new cacheline, this allows us to fit both structs in one cacheline */
    ALIGNED_(16) struct match current_match;
                 struct match next_match;

    /* For levels below 5, don't check the next position for a better match */
    int early_exit = s->level < 5;

    memset(&current_match, 0, sizeof(struct match));
    memset(&next_match, 0, sizeof(struct match));

    for (;;) {
        Pos hash_head = 0;    /* head of the hash chain */
        int bflush = 0;       /* set if current block must be flushed */
        int64_t dist;

        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need STD_MAX_MATCH bytes
         * for the next match, plus WANT_MIN_MATCH bytes to insert the
         * string following the next current_match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            PREFIX(fill_window)(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (UNLIKELY(s->lookahead == 0))
                break; /* flush the current block */
            next_match.match_length = 0;
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */

        /* If we already have a future match from a previous round, just use that */
        if (!early_exit && next_match.match_length > 0) {
            current_match = next_match;
            next_match.match_length = 0;
        } else {
            hash_head = 0;
            if (s->lookahead >= WANT_MIN_MATCH) {
                hash_head = quick_insert_string(s, s->strstart);
            }

            current_match.strstart = (uint16_t)s->strstart;
            current_match.orgstart = current_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                current_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                current_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(current_match.match_length < WANT_MIN_MATCH))
                    current_match.match_length = 1;
                if (UNLIKELY(current_match.match_start >= current_match.strstart)) {
                    /* this can happen due to some restarts */
                    current_match.match_length = 1;
                }
            } else {
                /* Set up the match to be a 1 byte literal */
                current_match.match_start = 0;
                current_match.match_length = 1;
            }
        }

        insert_match(s, current_match);

        /* now, look ahead one */
        if (LIKELY(!early_exit && s->lookahead > MIN_LOOKAHEAD && (uint32_t)(current_match.strstart + current_match.match_length) < (s->window_size - MIN_LOOKAHEAD))) {
            s->strstart = current_match.strstart + current_match.match_length;
            hash_head = quick_insert_string(s, s->strstart);

            next_match.strstart = (uint16_t)s->strstart;
            next_match.orgstart = next_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                next_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                next_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(next_match.match_start >= next_match.strstart)) {
                    /* this can happen due to some restarts */
                    next_match.match_length = 1;
                }
                if (next_match.match_length < WANT_MIN_MATCH)
                    next_match.match_length = 1;
                else
                    fizzle_matches(s, &current_match, &next_match);
            } else {
                /* Set up the match to be a 1 byte literal */
                next_match.match_start = 0;
                next_match.match_length = 1;
            }

            s->strstart = current_match.strstart;
        } else {
            next_match.match_length = 0;
        }

        /* now emit the current match */
        bflush = emit_match(s, current_match);

        /* move the "cursor" forward */
        s->strstart += current_match.match_length;

        if (UNLIKELY(bflush))
            FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < (STD_MIN_MATCH - 1) ? s->strstart : (STD_MIN_MATCH - 1);
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (UNLIKELY(s->sym_next))
        FLUSH_BLOCK(s, 0);

    return block_done;
}